

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  _Invoker_type *fromUser;
  SessionB local_f0;
  SessionB sessionBAlias;
  SessionB sessionB;
  Session sessionAlias;
  undefined1 local_98 [8];
  Session session;
  anon_class_1_0_00000001 cb;
  Id id;
  Profile copy;
  allocator local_41;
  string local_40 [32];
  Profile local_20;
  Profile profile;
  char **param_2_local;
  int param_1_local;
  
  profile.handle = (Profile_t *)param_2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"Alice",&local_41);
  HG::Profile::Profile(&local_20,(string *)local_40,0xb);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  HG::Profile::print(&local_20);
  HG::Profile::setAge(&local_20,0xc);
  HG::Profile::Profile((Profile *)&id,&local_20);
  HG::Profile::print((Profile *)&id);
  HG::Id::Id((Id *)&stack0xffffffffffffff98);
  HG::Id::applyLogic((Id *)&stack0xffffffffffffff98);
  fromUser = &sessionAlias.cb._M_invoker;
  std::function<void(int)>::function<main::__0&,void>
            ((function<void(int)> *)fromUser,
             (anon_class_1_0_00000001 *)((long)&session.cb._M_invoker + 7));
  HG::Session::Session((Session *)local_98,(SessionCB *)fromUser);
  std::function<void_(int)>::~function((function<void_(int)> *)&sessionAlias.cb._M_invoker);
  HG::Session::Session((Session *)&sessionB,(Session *)local_98);
  HG::Session::print((Session *)local_98,(ostream *)&std::cout);
  HG::Session::call((Session *)&sessionB);
  HG::SessionB::SessionB(&sessionBAlias);
  HG::SessionB::SessionB(&local_f0,&sessionBAlias);
  std::operator<<((ostream *)&std::cout,"======\n");
  HG::SessionB::~SessionB(&local_f0);
  HG::SessionB::~SessionB(&sessionBAlias);
  HG::Session::~Session((Session *)&sessionB);
  HG::Session::~Session((Session *)local_98);
  HG::Profile::~Profile((Profile *)&id);
  HG::Profile::~Profile(&local_20);
  return 0;
}

Assistant:

int main(int, char**) {
    HG::Profile profile("Alice", 11);
    profile.print();
    profile.setAge(12);
    HG::Profile copy(profile);
    copy.print();


    HG::Id id;
    id.applyLogic();

    // this is your std::function<void (int)>
    auto cb =
            [](int a){ std::cout << "Library gave " << a << " to callback\n"; };

    HG::Session session(cb);
    HG::Session sessionAlias(session);
    session.print(std::cout);
    sessionAlias.call();

    // `sessionAlias.call()` conceptually the same as:
    //Session_cb_t *cbptr = reinterpret_cast<Session_cb_t*>(&cb);
    //SessionHandlerCallerPtr  caller = &dispatchAny<decltype(cb), Session_cb_t>;
    //caller(cbptr, 42);

    HG::SessionB sessionB;
    HG::SessionB sessionBAlias(sessionB);

    std::cout << "======\n";

}